

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

void __thiscall Js::Utf8SourceInfo::EnsureLineOffsetCache(Utf8SourceInfo *this)

{
  Recycler *this_00;
  charcount_t startingCharacterOffset;
  LPCUTF8 puVar1;
  size_t sVar2;
  Recycler *alloc;
  LineOffsetCache *this_01;
  charcount_t startingByteOffset;
  undefined1 local_70 [8];
  TrackAllocData data;
  LPCUTF8 sourceAfterBOM;
  
  if ((this->m_lineOffsetCache).ptr != (LineOffsetCache *)0x0) {
    return;
  }
  puVar1 = GetSource(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
  sVar2 = GetCbLength(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
  data._32_8_ = puVar1;
  startingCharacterOffset = FunctionBody::SkipByteOrderMark((LPCUTF8 *)&data.line);
  this_00 = ((this->m_scriptContext).ptr)->recycler;
  local_70 = (undefined1  [8])&LineOffsetCache::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  startingByteOffset = data.line - (int)puVar1;
  data.count = (size_t)anon_var_dwarf_318408c;
  data.filename._0_4_ = 0x10d;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_70);
  this_01 = (LineOffsetCache *)new<Memory::Recycler>(0x10,alloc,0x37a1d4);
  LineOffsetCache::LineOffsetCache
            (this_01,this_00,(LPCUTF8)data._32_8_,puVar1 + sVar2,startingCharacterOffset,
             startingByteOffset);
  Memory::WriteBarrierPtr<Js::LineOffsetCache>::WriteBarrierSet(&this->m_lineOffsetCache,this_01);
  return;
}

Assistant:

void Utf8SourceInfo::EnsureLineOffsetCache()
    {
        if (this->m_lineOffsetCache == nullptr)
        {
            LPCUTF8 sourceStart = this->GetSource(_u("Utf8SourceInfo::AllocateLineOffsetCache"));
            LPCUTF8 sourceEnd = sourceStart + this->GetCbLength(_u("Utf8SourceInfo::AllocateLineOffsetCache"));

            LPCUTF8 sourceAfterBOM = sourceStart;
            charcount_t startChar = FunctionBody::SkipByteOrderMark(sourceAfterBOM /* byref */);
            int64 byteStartOffset = (sourceAfterBOM - sourceStart);

            Recycler* recycler = this->m_scriptContext->GetRecycler();
            this->m_lineOffsetCache = RecyclerNew(recycler, LineOffsetCache, recycler, sourceAfterBOM, sourceEnd, startChar, (int)byteStartOffset);
        }
    }